

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* add_matrix<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *a,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *b)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (a->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(a->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  uVar7 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data) >> 3;
  iVar6 = (int)uVar7;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)iVar6,&local_49);
  iVar9 = (int)uVar4;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar9,(value_type *)&local_48,&local_4a);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  uVar5 = 0;
  uVar7 = uVar7 & 0xffffffff;
  if (iVar6 < 1) {
    uVar7 = uVar5;
  }
  uVar4 = uVar4 & 0xffffffff;
  if (iVar9 < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pvVar1 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (b->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
      *(double *)
       (*(long *)&pvVar3[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar8 * 8) =
           *(double *)
            (*(long *)&pvVar1[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + uVar8 * 8) +
           *(double *)
            (*(long *)&pvVar2[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + uVar8 * 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > add_matrix(const std::vector<std::vector<T> >& a, const std::vector<std::vector<T> >& b){
    int n = a.size();
    int m = a[0].size();
    std::vector<std::vector<T> > ans(n, std::vector<T>(m));
    for (int i = 0; i < n; ++i)
        for (int j = 0; j < m; ++j)
            ans[i][j] = a[i][j] + b[i][j];
    return ans;
}